

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpVarint<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint64_t uVar1;
  ushort uVar2;
  FieldEntry *entry_00;
  TcParseTableBase *pTVar3;
  ParseContext *pPVar4;
  FieldEntry *pFVar5;
  ParseContext *p;
  MessageLite *x;
  int8_t iVar6;
  byte bVar7;
  bool bVar8;
  unsigned_short uVar9;
  uint32_t uVar10;
  int32_t iVar11;
  uint uVar12;
  char *pcVar13;
  FieldAux *pFVar14;
  unsigned_long *puVar15;
  LogMessage *pLVar16;
  bool *pbVar17;
  uint *puVar18;
  ulong uVar19;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool local_3e1;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_3b0;
  undefined1 local_3a8 [16];
  LogMessageFatal local_398 [19];
  Voidify local_385;
  unsigned_short local_384;
  unsigned_short local_382;
  string *local_380;
  string *absl_log_internal_check_op_result;
  void *base;
  MessageLite *pMStack_368;
  bool is_oneof;
  FieldAux local_360;
  ushort local_354;
  uint16_t rep;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_350;
  uint64_t local_348;
  uint64_t tmp;
  char *ptr2;
  bool is_validated_enum;
  bool is_zigzag;
  MessageLite *pMStack_330;
  uint16_t xform_val;
  MessageLite *local_328;
  ushort local_31c;
  ushort local_31a;
  uint16_t card;
  FieldEntry *pFStack_318;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_2d8;
  TcFieldData local_2d0;
  undefined1 local_2c1;
  FieldEntry *pFStack_2c0;
  bool always_return;
  TcParseTableBase *local_2b8;
  ParseContext *local_2b0;
  ParseContext *local_2a8;
  MessageLite *local_2a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_298;
  ulong local_290;
  int64_t res;
  ParseContext *local_280;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_278;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_270;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  int16_t lo;
  ushort uStack_1c6;
  bool local_1bd;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  ParseContext *local_158;
  ParseContext *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar10 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFStack_318 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar10)
  ;
  local_31a = pFStack_318->type_card;
  local_31c = local_31a & 0x30;
  if (local_31c == 0x20) {
    local_328 = msg_local;
    pcVar13 = MpRepeatedVarint<true>
                        ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                         (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar13;
  }
  uVar10 = TcFieldData::tag((TcFieldData *)&msg_local);
  if ((uVar10 & 7) != 0) {
    pMStack_330 = msg_local;
    pcVar13 = (char *)(**(code **)(hasbits_local + 0x30))
                                (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar13;
  }
  ptr2._6_2_ = local_31a & 0x600;
  ptr2._5_1_ = ptr2._6_2_ == 0x200;
  ptr2._4_1_ = (local_31a & 0x400) != 0;
  tmp = (uint64_t)ctx_local;
  local_280 = ctx_local;
  res = (int64_t)&local_348;
  local_158 = ctx_local;
  last.p = (char **)&local_158;
  res2 = (int64_t)&local_158;
  iVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
  local_290 = (ulong)iVar6;
  if (iVar6 < '\0') {
    local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_148 = &res3;
    res3 = (long)local_131 << 7 | local_290 >> 0x39;
    local_d9 = local_131;
    if (res3 < 0) {
      local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_130 = &local_188;
      local_188 = (long)local_119 << 0xe | local_290 >> 0x32;
      local_c9 = local_119;
      if ((long)local_188 < 0) {
        local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_118 = &res3;
        res3 = ((long)local_101 << 0x15 | local_290 >> 0x2b) & res3;
        local_b9 = local_101;
        if (res3 < 0) {
          local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               (&last);
          local_100 = &local_188;
          local_188 = ((long)local_e9 << 0x1c | local_290 >> 0x24) & local_188;
          local_a9 = local_e9;
          if ((long)local_188 < 0) {
            local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_a8 = &res3;
            res3 = ((long)local_91 << 0x23 | local_290 >> 0x1d) & res3;
            local_39 = local_91;
            if (res3 < 0) {
              local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_90 = &local_188;
              local_188 = ((long)local_79 << 0x2a | local_290 >> 0x16) & local_188;
              local_29 = local_79;
              if ((long)local_188 < 0) {
                local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_78 = &res3;
                res3 = ((long)local_61 << 0x31 | local_290 >> 0xf) & res3;
                local_19 = local_61;
                if (res3 < 0) {
                  local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_60 = &local_188;
                  local_188 = ((long)local_49 << 0x38 | local_290 >> 8) & local_188;
                  local_9 = local_49;
                  if (((long)local_188 < 0) &&
                     (iVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()(&last), iVar6 != '\x01')) {
                    iVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if (((int)iVar6 & 0x80U) != 0) {
                      local_150 = (ParseContext *)0x0;
                      goto LAB_0043e8e5;
                    }
                    bVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if ((bVar7 & 1) == 0) {
                      local_188 = local_188 ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
      res3 = local_188 & res3;
    }
    local_290 = res3 & local_290;
    if (local_158 == (ParseContext *)0x0) {
      protobuf_assumption_failed
                ("p != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/varint_shuffle.h"
                 ,0x91);
    }
    local_150 = local_158;
  }
  else {
    local_150 = local_158;
  }
LAB_0043e8e5:
  local_280 = local_150;
  *(ulong *)res = local_290;
  pcVar13 = ptr_local;
  pTVar3 = table_local;
  uVar2 = ptr2._6_2_;
  uVar1 = local_348;
  ctx_local = local_280;
  if (local_280 == (ParseContext *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffcb0);
    pcVar13 = Error((MessageLite *)pcVar13,(char *)0x0,(ParseContext *)pTVar3,
                    (TcFieldData)aStack_350,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar13;
  }
  local_354 = local_31a & 0x1c0;
  if (local_354 == 0xc0) {
    if ((ptr2._5_1_ & 1) != 0) {
      local_348 = WireFormatLite::ZigZagDecode64(local_348);
    }
  }
  else if (local_354 == 0x80) {
    uVar10 = (uint32_t)local_348;
    if ((ptr2._4_1_ & 1) == 0) {
      if ((ptr2._5_1_ & 1) != 0) {
        iVar11 = WireFormatLite::ZigZagDecode32(uVar10);
        local_348 = (uint64_t)iVar11;
      }
    }
    else {
      pFVar14 = TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,pFStack_318);
      local_360 = *pFVar14;
      if (uVar2 == 0x600) {
        lo = local_360._0_2_;
        local_3e1 = false;
        if ((int)lo <= (int)uVar10) {
          uStack_1c6 = local_360._2_2_;
          local_3e1 = (int)uVar10 < (int)((int)lo + (uint)uStack_1c6);
        }
        local_1bd = local_3e1;
      }
      else {
        local_1bd = ValidateEnum((internal *)(uVar1 & 0xffffffff),local_360.offset,
                                 local_360.enum_data);
      }
      if (local_1bd == false) {
        ctx_local = (ParseContext *)tmp;
        pMStack_368 = msg_local;
        pcVar13 = MpUnknownEnumFallback
                            ((MessageLite *)ptr_local,(char *)tmp,(ParseContext *)table_local,
                             (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,
                             (uint64_t)entry);
        return pcVar13;
      }
    }
  }
  uVar1 = hasbits_local;
  entry_00 = pFStack_318;
  base._7_1_ = local_31c == 0x30;
  if (local_31c == 0x10) {
    anon_unknown_130::SetHas(pFStack_318,(MessageLite *)ptr_local);
  }
  else if ((bool)base._7_1_) {
    uVar10 = TcFieldData::tag((TcFieldData *)&msg_local);
    ChangeOneof((TcParseTableBase *)uVar1,entry_00,uVar10 >> 3,(ParseContext *)table_local,
                (MessageLite *)ptr_local);
  }
  absl_log_internal_check_op_result =
       (string *)MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  uVar1 = local_348;
  if (local_354 == 0xc0) {
    puVar15 = RefAt<unsigned_long>(absl_log_internal_check_op_result,(ulong)pFStack_318->offset);
    *puVar15 = uVar1;
  }
  else if (local_354 == 0x80) {
    uVar12 = (uint)local_348;
    puVar18 = RefAt<unsigned_int>(absl_log_internal_check_op_result,(ulong)pFStack_318->offset);
    *puVar18 = uVar12;
  }
  else {
    local_382 = absl::lts_20240722::log_internal::GetReferenceableValue(local_354);
    local_384 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
    local_380 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          (&local_382,&local_384,
                           "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
    if (local_380 != (string *)0x0) {
      local_3a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_380);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_398,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x76d,local_3a8._0_8_,local_3a8._8_8_);
      pLVar16 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                          ((LogMessage *)local_398);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_385,pLVar16);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_398);
    }
    bVar8 = local_348 != 0;
    pbVar17 = RefAt<bool>(absl_log_internal_check_op_result,(ulong)pFStack_318->offset);
    *pbVar17 = bVar8;
  }
  pcVar13 = ptr_local;
  pPVar4 = ctx_local;
  pTVar3 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)&local_3b0);
  local_298 = local_3b0;
  local_2a0 = (MessageLite *)pcVar13;
  local_2a8 = pPVar4;
  local_2b0 = (ParseContext *)pTVar3;
  local_2b8 = (TcParseTableBase *)hasbits_local;
  pFStack_2c0 = entry;
  local_2c1 = 0;
  bVar8 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar3,(char *)pPVar4);
  x = local_2a0;
  p = local_2a8;
  pPVar4 = local_2b0;
  if (bVar8) {
    TcFieldData::TcFieldData(&local_2d8);
    pTVar3 = local_2b8;
    pFVar5 = pFStack_2c0;
    uVar9 = UnalignedLoad<unsigned_short>((char *)p);
    uVar19 = (ulong)(int)((uint)uVar9 & (uint)pTVar3->fast_idx_mask);
    if ((uVar19 & 7) == 0) {
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar3,uVar19 >> 3);
      local_270.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar9;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_278.data = local_270.data;
      pcVar13 = (*UNRECOVERED_JUMPTABLE)
                          (x,(char *)p,pPVar4,(TcFieldData)local_270,pTVar3,(uint64_t)pFVar5);
      return pcVar13;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  TcFieldData::TcFieldData(&local_2d0);
  if (local_2b8->has_bits_offset != 0) {
    uVar12 = (uint)pFStack_2c0;
    puVar18 = RefAt<unsigned_int>(x,(ulong)(uint)local_2b8->has_bits_offset);
    *puVar18 = uVar12 | *puVar18;
  }
  return (char *)p;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if ((data.tag() & 7) != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  // Parse the value:
  const char* ptr2 = ptr;  // save for unknown enum case
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ptr == nullptr) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // Transform and/or validate the value
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode64(tmp);
    }
  } else if (rep == field_layout::kRep32Bits) {
    if (is_validated_enum) {
      if (!EnumIsValidAux(tmp, xform_val, *table->field_aux(&entry))) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
    }
  }

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = tmp;
  } else if (rep == field_layout::kRep32Bits) {
    RefAt<uint32_t>(base, entry.offset) = static_cast<uint32_t>(tmp);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep8Bits));
    RefAt<bool>(base, entry.offset) = static_cast<bool>(tmp);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}